

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_vector_derefs.cpp
# Opt level: O1

ir_visitor_status __thiscall
anon_unknown.dwarf_84fe1::vector_deref_visitor::visit_enter
          (vector_deref_visitor *this,ir_assignment *ir)

{
  ir_factory *this_00;
  ir_dereference *piVar1;
  _func_int *p_Var2;
  exec_node *peVar3;
  exec_list *peVar4;
  exec_node *peVar5;
  glsl_type *type;
  ir_visitor_status iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  void *mem_ctx;
  ir_constant *this_01;
  ir_swizzle *piVar9;
  undefined4 extraout_var_00;
  ir_variable *var;
  ir_dereference_variable *piVar10;
  ir_variable *var_00;
  ir_assignment *piVar11;
  operand b;
  undefined4 extraout_var_01;
  ir_expression *piVar12;
  undefined4 extraout_var_02;
  ir_swizzle *lhs;
  operand a;
  uint component [1];
  operand local_50;
  operand local_48;
  uint local_3c;
  deref local_38;
  
  piVar1 = ir->lhs;
  if ((((piVar1 != (ir_dereference *)0x0) &&
       ((piVar1->super_ir_rvalue).super_ir_instruction.ir_type == ir_type_dereference_array)) &&
      (p_Var2 = piVar1[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction[4],
      1 < (byte)p_Var2[8])) &&
     ((p_Var2[9] == (_func_int)0x1 && ((*(uint *)(p_Var2 + 4) & 0xfc) < 0xc)))) {
    iVar7 = (*(piVar1->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[8])(piVar1);
    if ((*(uint *)(CONCAT44(extraout_var,iVar7) + 0x40) & 0xe000) != 0x2000) {
      lhs = (ir_swizzle *)piVar1[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction;
      mem_ctx = ralloc_parent(ir);
      peVar3 = piVar1[1].super_ir_rvalue.super_ir_instruction.super_exec_node.next;
      this_01 = (ir_constant *)(*(code *)peVar3->next[3].next)(peVar3,mem_ctx,0);
      if (this_01 == (ir_constant *)0x0) {
        if (*(int *)&(this->super_ir_rvalue_enter_visitor).super_ir_rvalue_base_visitor.
                     super_ir_hierarchical_visitor.field_0x34 == 1) {
          iVar7 = (*(piVar1->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[8])(piVar1);
          if ((*(uint *)(CONCAT44(extraout_var_00,iVar7) + 0x40) & 0xf000) == 0x5000) {
            this_00 = &this->factory;
            var = ir_builder::ir_factory::make_temp(this_00,ir->rhs->type,"scalar_tmp");
            peVar3 = &(ir->super_ir_instruction).super_exec_node;
            peVar4 = (this->factory).instructions;
            if ((peVar4->head_sentinel).next != &peVar4->tail_sentinel) {
              ((peVar4->tail_sentinel).prev)->next = peVar3;
              peVar5 = (peVar4->head_sentinel).next;
              peVar5->prev = (ir->super_ir_instruction).super_exec_node.prev;
              ((ir->super_ir_instruction).super_exec_node.prev)->next = peVar5;
              (ir->super_ir_instruction).super_exec_node.prev = (peVar4->tail_sentinel).prev;
              (peVar4->head_sentinel).next = &peVar4->tail_sentinel;
              (peVar4->head_sentinel).prev = (exec_node *)0x0;
              (peVar4->tail_sentinel).next = (exec_node *)0x0;
              (peVar4->tail_sentinel).prev = &peVar4->head_sentinel;
            }
            piVar10 = (ir_dereference_variable *)exec_node::operator_new(0x30,mem_ctx);
            ir_dereference_variable::ir_dereference_variable(piVar10,var);
            ir_assignment::set_lhs(ir,(ir_rvalue *)piVar10);
            var_00 = ir_builder::ir_factory::make_temp
                               (this_00,(glsl_type *)
                                        piVar1[1].super_ir_rvalue.super_ir_instruction.
                                        super_exec_node.next[2].next,"index_tmp");
            ir_builder::deref::deref(&local_38,var_00);
            piVar11 = ir_builder::assign(local_38,(ir_rvalue *)
                                                  piVar1[1].super_ir_rvalue.super_ir_instruction.
                                                  super_exec_node.next);
            ir_builder::ir_factory::emit(this_00,&piVar11->super_ir_instruction);
            if (((lhs->super_ir_rvalue).type)->vector_elements != '\0') {
              uVar8 = 0;
              do {
                b.val = &ir_constant::zero((this->factory).mem_ctx,
                                           (glsl_type *)
                                           piVar1[1].super_ir_rvalue.super_ir_instruction.
                                           super_exec_node.next[2].next)->super_ir_rvalue;
                *(uint *)&b.val[1].super_ir_instruction._vptr_ir_instruction = uVar8;
                a.val._0_4_ = (*(lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[4])
                                        (lhs,(this->factory).mem_ctx,0);
                a.val._4_4_ = extraout_var_01;
                piVar10 = (ir_dereference_variable *)exec_node::operator_new(0x30,mem_ctx);
                ir_dereference_variable::ir_dereference_variable(piVar10,var);
                if ((lhs->super_ir_rvalue).super_ir_instruction.ir_type == ir_type_swizzle) {
                  piVar11 = (ir_assignment *)exec_node::operator_new(0x40,mem_ctx);
                  piVar9 = ir_builder::swizzle(a,uVar8,1);
                  ir_builder::operand::operand(&local_50,var_00);
                  piVar12 = ir_builder::equal(local_50,b);
                  ir_assignment::ir_assignment
                            (piVar11,&piVar9->super_ir_rvalue,(ir_rvalue *)piVar10,
                             &piVar12->super_ir_rvalue);
                }
                else {
                  if ((a.val == (ir_rvalue *)0x0) ||
                     (ir_type_dereference_variable < ((a.val)->super_ir_instruction).ir_type)) {
                    __assert_fail("lhs_clone->as_dereference()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_vector_derefs.cpp"
                                  ,0x72,
                                  "virtual ir_visitor_status (anonymous namespace)::vector_deref_visitor::visit_enter(ir_assignment *)"
                                 );
                  }
                  piVar11 = (ir_assignment *)exec_node::operator_new(0x40,mem_ctx);
                  if (ir_type_dereference_variable < ((a.val)->super_ir_instruction).ir_type) {
                    a.val = (ir_rvalue *)0x0;
                  }
                  ir_builder::operand::operand(&local_48,var_00);
                  piVar12 = ir_builder::equal(local_48,b);
                  ir_assignment::ir_assignment
                            (piVar11,(ir_dereference *)a.val,(ir_rvalue *)piVar10,
                             &piVar12->super_ir_rvalue,1 << ((byte)uVar8 & 0x1f));
                }
                ir_builder::ir_factory::emit(this_00,&piVar11->super_ir_instruction);
                uVar8 = uVar8 + 1;
              } while (uVar8 < ((lhs->super_ir_rvalue).type)->vector_elements);
            }
            peVar4 = this_00->instructions;
            if ((peVar4->head_sentinel).next != &peVar4->tail_sentinel) {
              ((peVar4->tail_sentinel).prev)->next = peVar3->next;
              peVar5 = (peVar4->head_sentinel).next;
              peVar5->prev = peVar3;
              peVar3->next->prev = (peVar4->tail_sentinel).prev;
              peVar3->next = peVar5;
              (peVar4->head_sentinel).next = &peVar4->tail_sentinel;
              (peVar4->head_sentinel).prev = (exec_node *)0x0;
              (peVar4->tail_sentinel).next = (exec_node *)0x0;
              (peVar4->tail_sentinel).prev = &peVar4->head_sentinel;
            }
            goto LAB_0017be11;
          }
        }
        piVar12 = (ir_expression *)exec_node::operator_new(0x58,mem_ctx);
        type = (lhs->super_ir_rvalue).type;
        iVar7 = (*(lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[4])
                          (lhs,mem_ctx,0);
        ir_expression::ir_expression
                  (piVar12,0x96,type,(ir_rvalue *)CONCAT44(extraout_var_02,iVar7),ir->rhs,
                   (ir_rvalue *)piVar1[1].super_ir_rvalue.super_ir_instruction.super_exec_node.next,
                   (ir_rvalue *)0x0);
        ir->rhs = (ir_rvalue *)piVar12;
        ir->field_0x38 =
             (ir->field_0x38 & 0xf0 |
             (byte)(-1 << (((lhs->super_ir_rvalue).type)->vector_elements & 0x1f)) & 0xf) ^ 0xf;
      }
      else {
        if ((lhs->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_swizzle) {
          ir_assignment::set_lhs(ir,(ir_rvalue *)lhs);
          uVar8 = ir_constant::get_uint_component(this_01,0);
          ir->field_0x38 = ir->field_0x38 & 0xf0 | (byte)(1 << ((byte)uVar8 & 0x1f)) & 0xf;
          goto LAB_0017be11;
        }
        local_3c = ir_constant::get_uint_component(this_01,0);
        piVar9 = (ir_swizzle *)exec_node::operator_new(0x38,mem_ctx);
        ir_swizzle::ir_swizzle(piVar9,(ir_rvalue *)lhs,&local_3c,1);
        lhs = piVar9;
      }
      ir_assignment::set_lhs(ir,&lhs->super_ir_rvalue);
    }
  }
LAB_0017be11:
  iVar6 = ir_rvalue_enter_visitor::visit_enter(&this->super_ir_rvalue_enter_visitor,ir);
  return iVar6;
}

Assistant:

ir_visitor_status
vector_deref_visitor::visit_enter(ir_assignment *ir)
{
   if (!ir->lhs || ir->lhs->ir_type != ir_type_dereference_array)
      return ir_rvalue_enter_visitor::visit_enter(ir);

   ir_dereference_array *const deref = (ir_dereference_array *) ir->lhs;
   if (!deref->array->type->is_vector())
      return ir_rvalue_enter_visitor::visit_enter(ir);

   /* SSBOs and shared variables are backed by memory and may be accessed by
    * multiple threads simultaneously.  It's not safe to lower a single
    * component store to a load-vec-store because it may race with writes to
    * other components.
    */
   ir_variable *var = deref->variable_referenced();
   if (var->data.mode == ir_var_shader_storage ||
       var->data.mode == ir_var_shader_shared)
      return ir_rvalue_enter_visitor::visit_enter(ir);

   ir_rvalue *const new_lhs = deref->array;

   void *mem_ctx = ralloc_parent(ir);
   ir_constant *old_index_constant =
      deref->array_index->constant_expression_value(mem_ctx);
   if (!old_index_constant) {
      if (shader_stage == MESA_SHADER_TESS_CTRL &&
          deref->variable_referenced()->data.mode == ir_var_shader_out) {
         /* Tessellation control shader outputs act as if they have memory
          * backing them and if we have writes from multiple threads
          * targeting the same vec4 (this can happen for patch outputs), the
          * load-vec-store pattern of ir_triop_vector_insert doesn't work.
          * Instead, we have to lower to a series of conditional write-masked
          * assignments.
          */
         ir_variable *const src_temp =
            factory.make_temp(ir->rhs->type, "scalar_tmp");

         /* The newly created variable declaration goes before the assignment
          * because we're going to set it as the new LHS.
          */
         ir->insert_before(factory.instructions);
         ir->set_lhs(new(mem_ctx) ir_dereference_variable(src_temp));

         ir_variable *const arr_index =
            factory.make_temp(deref->array_index->type, "index_tmp");
         factory.emit(assign(arr_index, deref->array_index));

         for (unsigned i = 0; i < new_lhs->type->vector_elements; i++) {
            ir_constant *const cmp_index =
               ir_constant::zero(factory.mem_ctx, deref->array_index->type);
            cmp_index->value.u[0] = i;

            ir_rvalue *const lhs_clone = new_lhs->clone(factory.mem_ctx, NULL);
            ir_dereference_variable *const src_temp_deref =
               new(mem_ctx) ir_dereference_variable(src_temp);

            if (new_lhs->ir_type != ir_type_swizzle) {
               assert(lhs_clone->as_dereference());
               ir_assignment *cond_assign =
                  new(mem_ctx) ir_assignment(lhs_clone->as_dereference(),
                                             src_temp_deref,
                                             equal(arr_index, cmp_index),
                                             WRITEMASK_X << i);
               factory.emit(cond_assign);
            } else {
               ir_assignment *cond_assign =
                  new(mem_ctx) ir_assignment(swizzle(lhs_clone, i, 1),
                                             src_temp_deref,
                                             equal(arr_index, cmp_index));
               factory.emit(cond_assign);
            }
         }
         ir->insert_after(factory.instructions);
      } else {
         ir->rhs = new(mem_ctx) ir_expression(ir_triop_vector_insert,
                                              new_lhs->type,
                                              new_lhs->clone(mem_ctx, NULL),
                                              ir->rhs,
                                              deref->array_index);
         ir->write_mask = (1 << new_lhs->type->vector_elements) - 1;
         ir->set_lhs(new_lhs);
      }
   } else if (new_lhs->ir_type != ir_type_swizzle) {
      ir->set_lhs(new_lhs);
      ir->write_mask = 1 << old_index_constant->get_uint_component(0);
   } else {
      /* If the "new" LHS is a swizzle, use the set_lhs helper to instead
       * swizzle the RHS.
       */
      unsigned component[1] = { old_index_constant->get_uint_component(0) };
      ir->set_lhs(new(mem_ctx) ir_swizzle(new_lhs, component, 1));
   }

   return ir_rvalue_enter_visitor::visit_enter(ir);
}